

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O0

bool CoreML::hasCoreML6Opsets(Model *model)

{
  bool bVar1;
  TypeCase TVar2;
  Program *pPVar3;
  Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Function>
  *pMVar4;
  const_pointer pvVar5;
  string *__lhs;
  Function *main;
  allocator<char> local_51;
  key_type local_50;
  undefined1 local_30 [8];
  const_iterator main_iter;
  Model *model_local;
  
  main_iter.it_.bucket_index_ = (size_type)model;
  TVar2 = Specification::Model::Type_case(model);
  if (TVar2 == kMlProgram) {
    pPVar3 = Specification::Model::mlprogram((Model *)main_iter.it_.bucket_index_);
    pMVar4 = Specification::MILSpec::Program::functions_abi_cxx11_(pPVar3);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"main",&local_51);
    google::protobuf::
    Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Function>
    ::find((const_iterator *)local_30,pMVar4,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::allocator<char>::~allocator(&local_51);
    pPVar3 = Specification::Model::mlprogram((Model *)main_iter.it_.bucket_index_);
    pMVar4 = Specification::MILSpec::Program::functions_abi_cxx11_(pPVar3);
    google::protobuf::
    Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Function>
    ::end((const_iterator *)&main,pMVar4);
    bVar1 = google::protobuf::operator!=((const_iterator *)local_30,(const_iterator *)&main);
    if (bVar1) {
      pvVar5 = google::protobuf::
               Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Function>
               ::const_iterator::operator->((const_iterator *)local_30);
      __lhs = Specification::MILSpec::Function::opset_abi_cxx11_(&pvVar5->second);
      bVar1 = std::operator==(__lhs,"CoreML6");
      if (bVar1) {
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool CoreML::hasCoreML6Opsets(const Specification::Model& model) {
    if (model.Type_case() == Specification::Model::kMlProgram) {
        auto main_iter = model.mlprogram().functions().find("main");
        if (main_iter != model.mlprogram().functions().end()) {
            const auto& main = main_iter->second;
            if (main.opset() == "CoreML6") {
                return true;
            }
        }
    }
    return false;
}